

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::GetPointerTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *data_type,StorageClass *storage_class)

{
  uint16_t uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  Instruction *pIVar5;
  
  *storage_class = Max;
  if (id == 0) {
LAB_0067534e:
    bVar3 = false;
  }
  else {
    pIVar5 = FindDef(this,id);
    if (pIVar5 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4c2,
                    "bool spvtools::val::ValidationState_t::GetPointerTypeInfo(uint32_t, uint32_t *, spv::StorageClass *) const"
                   );
    }
    uVar1 = (pIVar5->inst_).opcode;
    if (uVar1 == 0x20) {
      puVar2 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *storage_class = puVar2[2];
      uVar4 = puVar2[3];
    }
    else {
      if (uVar1 != 0x1141) goto LAB_0067534e;
      *storage_class =
           (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      uVar4 = 0;
    }
    *data_type = uVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ValidationState_t::GetPointerTypeInfo(
    uint32_t id, uint32_t* data_type, spv::StorageClass* storage_class) const {
  *storage_class = spv::StorageClass::Max;
  if (!id) return false;

  const Instruction* inst = FindDef(id);
  assert(inst);
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
    *storage_class = spv::StorageClass(inst->word(2));
    *data_type = 0;
    return true;
  }

  if (inst->opcode() != spv::Op::OpTypePointer) return false;

  *storage_class = spv::StorageClass(inst->word(2));
  *data_type = inst->word(3);
  return true;
}